

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

char * id2name(name_map *map,int max,uint id)

{
  long lVar1;
  
  if (max < 1) {
    return (char *)0x0;
  }
  lVar1 = 0;
  do {
    if (*(uint *)((long)&map->id + lVar1) == id) {
      return *(char **)((long)&map->name + lVar1);
    }
    lVar1 = lVar1 + 0x10;
  } while ((ulong)(uint)max << 4 != lVar1);
  return (char *)0x0;
}

Assistant:

const char *id2name(const name_map* map, int max, const unsigned int id)
{
	int i;

	for (i = 0; i < max; i++) {
		if (map[i].id == id) {
			return map[i].name;
		}
	}

	// nothing match
	return NULL;
}